

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall slang::SVInt::xnor(SVInt *this,SVInt *rhs)

{
  ulong *puVar1;
  bool bVar2;
  uint uVar3;
  uint64_t *puVar4;
  uint uVar5;
  ulong uVar6;
  SVInt *pSVar7;
  ulong uVar8;
  ulong *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  SVInt SVar10;
  SVInt local_30;
  
  uVar5 = (rhs->super_SVIntStorage).bitWidth;
  uVar3 = (uint)in_RDX[1];
  if (uVar5 != uVar3) {
    if (uVar5 < uVar3) {
      extend(&local_30,(bitwidth_t)rhs,SUB41(uVar3,0));
      xnor(this,&local_30);
    }
    else {
      extend(&local_30,(bitwidth_t)in_RDX,SUB41(uVar5,0));
      xnor(this,rhs);
    }
    ~SVInt(&local_30);
    uVar9 = extraout_RDX;
    goto LAB_0018c2b4;
  }
  SVInt(this,&rhs->super_SVIntStorage);
  if (((rhs->super_SVIntStorage).unknownFlag == false) && (*(char *)((long)in_RDX + 0xd) == '\x01'))
  {
    makeUnknown(this);
  }
  bVar2 = (this->super_SVIntStorage).unknownFlag;
  if ((this->super_SVIntStorage).bitWidth < 0x41 && (bVar2 & 1U) == 0) {
    uVar8 = (this->super_SVIntStorage).field_0.val ^ *in_RDX;
    pSVar7 = this;
LAB_0018c2a6:
    (pSVar7->super_SVIntStorage).field_0.val = ~uVar8;
  }
  else {
    uVar5 = (rhs->super_SVIntStorage).bitWidth + 0x3f >> 6;
    if ((bVar2 & 1U) == 0) {
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        puVar4 = (this->super_SVIntStorage).field_0.pVal;
        puVar4[uVar8] = ~(puVar4[uVar8] ^ *(ulong *)(*in_RDX + uVar8 * 8));
      }
    }
    else {
      if ((uint)in_RDX[1] < 0x41 && (*(byte *)((long)in_RDX + 0xd) & 1) == 0) {
        pSVar7 = (SVInt *)(this->super_SVIntStorage).field_0.val;
        uVar8._0_4_ = (pSVar7->super_SVIntStorage).bitWidth;
        uVar8._4_1_ = (pSVar7->super_SVIntStorage).signFlag;
        uVar8._5_1_ = (pSVar7->super_SVIntStorage).unknownFlag;
        uVar8._6_2_ = *(undefined2 *)&(pSVar7->super_SVIntStorage).field_0xe;
        uVar8 = *in_RDX ^ (pSVar7->super_SVIntStorage).field_0.val | uVar8;
        goto LAB_0018c2a6;
      }
      uVar6 = (ulong)uVar5;
      uVar8 = uVar6;
      if ((*(byte *)((long)in_RDX + 0xd) & 1) != 0) {
        while (uVar8 != 0) {
          puVar1 = (this->super_SVIntStorage).field_0.pVal + uVar6;
          *puVar1 = *puVar1 | *(ulong *)(*in_RDX + uVar6 * 8);
          uVar6 = uVar6 + 1;
          uVar8 = uVar8 - 1;
        }
      }
      for (uVar8 = 0; uVar5 << 3 != uVar8; uVar8 = uVar8 + 8) {
        puVar4 = (this->super_SVIntStorage).field_0.pVal;
        *(ulong *)((long)puVar4 + uVar8) =
             ~(*(ulong *)(*in_RDX + uVar8) ^ *(ulong *)((long)puVar4 + uVar8) |
              *(ulong *)((long)puVar4 + (uVar5 << 3) + uVar8));
      }
    }
  }
  clearUnusedBits(this);
  uVar9 = extraout_RDX_00;
LAB_0018c2b4:
  SVar10.super_SVIntStorage.bitWidth = (int)uVar9;
  SVar10.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar9 >> 0x20);
  SVar10.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar9 >> 0x28);
  SVar10.super_SVIntStorage._14_2_ = (short)((ulong)uVar9 >> 0x30);
  SVar10.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar10.super_SVIntStorage;
}

Assistant:

SVInt SVInt::xnor(const SVInt& rhs) const {
    if (bitWidth != rhs.bitWidth) {
        bool bothSigned = signFlag && rhs.signFlag;
        if (bitWidth < rhs.bitWidth)
            return extend(rhs.bitWidth, bothSigned).xnor(rhs);
        else
            return xnor(rhs.extend(bitWidth, bothSigned));
    }

    SVInt result(*this);
    if (!hasUnknown() && rhs.hasUnknown())
        result.makeUnknown();

    if (result.isSingleWord())
        result.val = ~(result.val ^ rhs.val);
    else {
        uint32_t words = getNumWords(bitWidth, false);
        if (result.hasUnknown()) {
            if (rhs.isSingleWord())
                result.pVal[0] = ~result.pVal[1] & ~(result.pVal[0] ^ rhs.val);
            else {
                if (rhs.hasUnknown()) {
                    for (uint32_t i = 0; i < words; i++)
                        result.pVal[i + words] |= rhs.pVal[i + words];
                }

                for (uint32_t i = 0; i < words; i++)
                    result.pVal[i] = ~result.pVal[i + words] & ~(result.pVal[i] ^ rhs.pVal[i]);
            }
        }
        else {
            for (uint32_t i = 0; i < words; i++)
                result.pVal[i] = ~(result.pVal[i] ^ rhs.pVal[i]);
        }
    }
    result.clearUnusedBits();
    return result;
}